

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylnsymmat.cpp
# Opt level: O1

int __thiscall
TPZSkylNSymMatrix<double>::Subst_LForward(TPZSkylNSymMatrix<double> *this,TPZFMatrix<double> *B)

{
  char cVar1;
  double **ppdVar2;
  double *pdVar3;
  int iVar4;
  undefined4 extraout_var;
  int extraout_var_00;
  long lVar5;
  int iVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double *pdVar11;
  double dVar12;
  long local_50;
  
  lVar9 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  iVar4 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  iVar6 = 0;
  if ((lVar9 == CONCAT44(extraout_var,iVar4)) &&
     ((cVar1 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed, cVar1 == '\x04' ||
      (cVar1 == '\x01')))) {
    iVar4 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0xc])(this);
    iVar6 = 1;
    if (CONCAT44(extraout_var_00,iVar4) != 0 && -1 < extraout_var_00) {
      local_50 = -8;
      lVar9 = 0;
      do {
        if (0 < (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol) {
          lVar10 = 0;
          lVar8 = 0;
          do {
            ppdVar2 = (this->fElemb).fStore;
            pdVar3 = ppdVar2[lVar9 + 1];
            if ((B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar5 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            pdVar11 = ppdVar2[lVar9] + 1;
            dVar12 = 0.0;
            if (pdVar11 < pdVar3) {
              pdVar7 = (double *)((long)B->fElem + lVar5 * lVar10 + local_50);
              do {
                dVar12 = dVar12 + *pdVar11 * *pdVar7;
                pdVar11 = pdVar11 + 1;
                pdVar7 = pdVar7 + -1;
              } while (pdVar11 < pdVar3);
            }
            if ((lVar5 <= lVar9) || ((B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar8)
               ) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar5 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar8;
            B->fElem[lVar5 + lVar9] = B->fElem[lVar5 + lVar9] - dVar12;
            lVar8 = lVar8 + 1;
            lVar10 = lVar10 + 8;
          } while (lVar8 < (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol);
        }
        lVar9 = lVar9 + 1;
        local_50 = local_50 + 8;
      } while (lVar9 != CONCAT44(extraout_var_00,iVar4));
      iVar6 = 1;
    }
  }
  return iVar6;
}

Assistant:

int TPZSkylNSymMatrix<TVar>::Subst_LForward(TPZFMatrix<TVar> *B)const
{
  if ((B->Rows() != this->Dim()) || (this->fDecomposed != ELDLt && this->fDecomposed != ELU))
    return(0);

  int64_t dimension = this->Dim();
  for (int64_t k = 0; k < dimension; k++)
  {
    for (int64_t j = 0; j < B->Cols(); j++)
    {
      // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
      //
      TVar sum = 0.0;
      TVar *elem_ki = fElemb[k] + 1;
      TVar *end_ki = fElemb[k + 1];
      TVar *BPtr = &(*B)(k, j);
      while (elem_ki < end_ki)
        sum += (*elem_ki++) * (*--BPtr);

      // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
      //
      // B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
      BPtr = &(*B)(k, j);
      *BPtr -= sum;
    }
  }
  return(1);
}